

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::LookupBucketFor<unsigned_int>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,uint *Val,DenseSetPair<llvm::DWARFDebugNames::Abbrev> **FoundBucket)

{
  uint32_t LHS;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar4;
  Abbrev *pAVar5;
  pointer local_c8;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *ThisBucket;
  uint local_90;
  uint ProbeAmt;
  uint BucketNo;
  undefined1 local_80 [8];
  Abbrev TombstoneKey;
  Abbrev EmptyKey;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *FoundTombstone;
  uint NumBuckets;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *BucketsPtr;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> **FoundBucket_local;
  uint *Val_local;
  DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  *this_local;
  
  pDVar4 = getBuckets(this);
  uVar3 = getNumBuckets(this);
  if (uVar3 == 0) {
    *FoundBucket = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
    this_local._7_1_ = false;
  }
  else {
    EmptyKey.Attributes.
    super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getEmptyKey();
    getTombstoneKey();
    bVar1 = DWARFDebugNames::AbbrevMapInfo::isEqual
                      (*Val,(Abbrev *)
                            &TombstoneKey.Attributes.
                             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = false;
    if (!bVar1) {
      bVar1 = DWARFDebugNames::AbbrevMapInfo::isEqual(*Val,(Abbrev *)local_80);
      bVar2 = false;
      if (!bVar1) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, BucketT = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, LookupKeyT = unsigned int]"
                   );
    }
    local_90 = getHashValue<unsigned_int>(Val);
    local_90 = local_90 & uVar3 - 1;
    ThisBucket._4_4_ = 1;
    while( true ) {
      local_c8 = (pointer)(pDVar4 + local_90);
      LHS = *Val;
      pAVar5 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst
                         ((DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)local_c8);
      bVar2 = DWARFDebugNames::AbbrevMapInfo::isEqual(LHS,pAVar5);
      if (bVar2) break;
      pAVar5 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst
                         ((DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)local_c8);
      bVar2 = DWARFDebugNames::AbbrevMapInfo::isEqual
                        (pAVar5,(Abbrev *)
                                &TombstoneKey.Attributes.
                                 super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        if (EmptyKey.Attributes.
            super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          local_c8 = EmptyKey.Attributes.
                     super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        *FoundBucket = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)local_c8;
        this_local._7_1_ = false;
        goto LAB_027b7236;
      }
      pAVar5 = detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>::getFirst
                         ((DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)local_c8);
      bVar2 = DWARFDebugNames::AbbrevMapInfo::isEqual(pAVar5,(Abbrev *)local_80);
      if ((bVar2) &&
         (EmptyKey.Attributes.
          super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) {
        EmptyKey.Attributes.
        super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
      }
      local_90 = uVar3 - 1 & ThisBucket._4_4_ + local_90;
      ThisBucket._4_4_ = ThisBucket._4_4_ + 1;
    }
    *FoundBucket = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)local_c8;
    this_local._7_1_ = true;
LAB_027b7236:
    DWARFDebugNames::Abbrev::~Abbrev((Abbrev *)local_80);
    DWARFDebugNames::Abbrev::~Abbrev
              ((Abbrev *)
               &TombstoneKey.Attributes.
                super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return this_local._7_1_;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }